

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O3

void __thiscall
rest_rpc::rpc_client::rpc_client
          (rpc_client *this,client_language_t client_language,
          function<void_(long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *on_result_received_callback)

{
  io_context *this_00;
  atomic_count *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  impl_type *piVar4;
  undefined8 uVar5;
  type_info *ptVar6;
  id *piVar7;
  value_type *__val;
  service_type *psVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  pointer __s;
  undefined1 local_71 [9];
  key local_68;
  deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  *local_58;
  steady_timer *local_50;
  condition_variable *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_class_8_1_8991fb9c_for__M_head_impl local_38;
  
  this_00 = &this->ios_;
  asio::io_context::io_context(this_00);
  local_68.type_info_ =
       (type_info *)
       &asio::detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::tcp>>::typeinfo
  ;
  local_68.id_ = (id *)0x0;
  psVar8 = (service_type *)
           asio::detail::service_registry::do_use_service
                     ((this->ios_).super_execution_context.service_registry_,&local_68,
                      asio::detail::service_registry::
                      create<asio::detail::reactive_socket_service<asio::ip::tcp>,asio::io_context>,
                      this_00);
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.service_ = psVar8;
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
  protocol_.family_ = 2;
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_fns_ =
       (target_fns *)
       asio::execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value,void>::type*)
       ::fns_with_execute;
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.object_fns_ =
       (object_fns *)
       asio::execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0ul>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  *(io_context **)
   &(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
    super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
    .super_any_executor_base.object_ = this_00;
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .super_any_executor_base.target_ =
       &(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_;
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.executor_.
  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  .prop_fns_ = (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)asio::execution::
                  any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
                  ::
                  prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>()
                  ::fns;
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.socket_ = -1;
  (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.implementation_.
  super_base_implementation_type.state_ = '\0';
  (this->work_).super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001b3a18;
  piVar4 = (this->ios_).impl_;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)piVar4;
  LOCK();
  paVar1 = &piVar4->outstanding_work_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  (this->work_).super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var9;
  (this->work_).super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  (this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  paVar2 = &(this->host_).field_2;
  (this->host_)._M_dataplus._M_p = (pointer)paVar2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  this->port_ = 0;
  this->connect_timeout_ = 1000;
  this->reconnect_cnt_ = -1;
  (this->has_connected_)._M_base._M_i = false;
  (this->conn_mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->conn_mtx_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->conn_mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->conn_mtx_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->conn_mtx_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_48 = &this->conn_cond_;
  std::condition_variable::condition_variable(local_48);
  this->has_wait_ = false;
  local_40 = paVar2;
  asio::detail::
  io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&(this->deadline_).impl_,0,0,this_00);
  this->stop_client_ = false;
  local_58 = &this->outbox_;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->outbox_).
  super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_50 = &this->deadline_;
  std::
  _Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ::_M_initialize_map(&local_58->
                       super__Deque_base<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                      ,0);
  this->write_size_ = 0;
  (this->write_mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->write_mtx_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->write_mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->write_mtx_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->write_mtx_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->fu_id_ = 0;
  *(undefined8 *)&(this->err_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->err_cb_).super__Function_base._M_functor + 8) = 0;
  (this->err_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->err_cb_)._M_invoker = (_Invoker_type)0x0;
  this->enable_reconnect_ = false;
  (this->future_map_)._M_h._M_buckets = &(this->future_map_)._M_h._M_single_bucket;
  (this->future_map_)._M_h._M_bucket_count = 1;
  (this->future_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->future_map_)._M_h._M_element_count = 0;
  (this->future_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->future_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->future_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->callback_map_)._M_h._M_buckets = &(this->callback_map_)._M_h._M_single_bucket;
  (this->callback_map_)._M_h._M_bucket_count = 1;
  (this->callback_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->callback_map_)._M_h._M_element_count = 0;
  (this->callback_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->head_[4] = '\0';
  this->head_[5] = '\0';
  this->head_[6] = '\0';
  this->head_[7] = '\0';
  this->head_[8] = '\0';
  this->head_[9] = '\0';
  this->head_[10] = '\0';
  this->head_[0xb] = '\0';
  this->head_[0xc] = '\0';
  this->head_[0xd] = '\0';
  this->head_[0xe] = '\0';
  this->head_[0xf] = '\0';
  this->head_[0x10] = '\0';
  this->head_[0x11] = '\0';
  this->head_[0x12] = '\0';
  this->head_[0x13] = '\0';
  this->temp_req_id_ = 0;
  this->head_[0] = '\0';
  this->head_[1] = '\0';
  this->head_[2] = '\0';
  this->head_[3] = '\0';
  this->head_[4] = '\0';
  this->head_[5] = '\0';
  this->head_[6] = '\0';
  this->head_[7] = '\0';
  (this->cb_mtx_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->callback_id_ = 0;
  *(undefined8 *)((long)&(this->cb_mtx_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cb_mtx_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->cb_mtx_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cb_mtx_).super___mutex_base._M_mutex + 8) = 0;
  (this->callback_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->callback_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __s = (pointer)operator_new(0x800);
  (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = __s;
  (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x800;
  memset(__s,0,0x800);
  (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __s + 0x800;
  (this->sub_map_)._M_h._M_buckets = &(this->sub_map_)._M_h._M_single_bucket;
  (this->sub_map_)._M_h._M_bucket_count = 1;
  (this->sub_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sub_map_)._M_h._M_element_count = 0;
  (this->sub_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sub_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sub_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var3 = &(this->key_token_set_)._M_t._M_impl.super__Rb_tree_header;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->key_token_set_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->client_language_ = client_language;
  *(undefined8 *)&(this->on_result_received_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->on_result_received_callback_).super__Function_base._M_functor + 8) =
       0;
  (this->on_result_received_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->on_result_received_callback_)._M_invoker = on_result_received_callback->_M_invoker;
  if ((on_result_received_callback->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar5 = *(undefined8 *)
             ((long)&(on_result_received_callback->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->on_result_received_callback_).super__Function_base._M_functor =
         *(undefined8 *)&(on_result_received_callback->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->on_result_received_callback_).super__Function_base._M_functor + 8)
         = uVar5;
    (this->on_result_received_callback_).super__Function_base._M_manager =
         (on_result_received_callback->super__Function_base)._M_manager;
    (on_result_received_callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    on_result_received_callback->_M_invoker = (_Invoker_type)0x0;
  }
  local_68.type_info_ = (type_info *)0x0;
  local_38.this = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::thread,std::allocator<std::thread>,rest_rpc::rpc_client::rpc_client(rest_rpc::client_language_t,std::function<void(long,std::__cxx11::string_const&)>)::_lambda()_1_>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.id_,(thread **)&local_68,
             (allocator<std::thread> *)local_71,&local_38);
  piVar7 = local_68.id_;
  ptVar6 = local_68.type_info_;
  local_68.type_info_ = (type_info *)0x0;
  local_68.id_ = (id *)0x0;
  p_Var9 = (this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ptVar6;
  (this->thd_).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)piVar7;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.id_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.id_);
    }
  }
  return;
}

Assistant:

rpc_client(client_language_t client_language,
             std::function<void(long, const std::string &)>
                 on_result_received_callback)
      : socket_(ios_), work_(std::make_shared<asio::io_context::work>(ios_)),
        deadline_(ios_), body_(INIT_BUF_SIZE),
        client_language_(client_language),
        on_result_received_callback_(std::move(on_result_received_callback)) {
    thd_ = std::make_shared<std::thread>([this] { ios_.run(); });
  }